

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

void __thiscall ORPG::Characters::RaceSelector::RaceSelector(RaceSelector *this)

{
  race_node *prVar1;
  undefined4 *puVar2;
  undefined4 *puVar3;
  undefined4 *puVar4;
  undefined4 *puVar5;
  undefined4 *puVar6;
  undefined4 *local_48;
  undefined4 *local_40;
  undefined4 *local_38;
  
  prVar1 = (race_node *)operator_new(0x28);
  (prVar1->children).
  super__Vector_base<ORPG::Characters::RaceSelector::race_node_*,_std::allocator<ORPG::Characters::RaceSelector::race_node_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (prVar1->children).
  super__Vector_base<ORPG::Characters::RaceSelector::race_node_*,_std::allocator<ORPG::Characters::RaceSelector::race_node_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (prVar1->children).
  super__Vector_base<ORPG::Characters::RaceSelector::race_node_*,_std::allocator<ORPG::Characters::RaceSelector::race_node_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  prVar1->raceID = 0x1b800000;
  prVar1->required = false;
  prVar1->parent = (race_node *)0x0;
  this->head = prVar1;
  puVar2 = (undefined4 *)operator_new(0x28);
  *(undefined8 *)(puVar2 + 4) = 0;
  *(undefined8 *)(puVar2 + 6) = 0;
  *(undefined8 *)(puVar2 + 8) = 0;
  *puVar2 = 0x1b800001;
  *(undefined1 *)(puVar2 + 1) = 1;
  *(race_node **)(puVar2 + 2) = prVar1;
  puVar3 = (undefined4 *)operator_new(0x28);
  *(undefined8 *)(puVar3 + 4) = 0;
  *(undefined8 *)(puVar3 + 6) = 0;
  *(undefined8 *)(puVar3 + 8) = 0;
  *puVar3 = 0x1b800010;
  *(undefined1 *)(puVar3 + 1) = 1;
  *(race_node **)(puVar3 + 2) = prVar1;
  puVar4 = (undefined4 *)operator_new(0x28);
  *(undefined8 *)(puVar4 + 4) = 0;
  *(undefined8 *)(puVar4 + 6) = 0;
  *(undefined8 *)(puVar4 + 8) = 0;
  *puVar4 = 0x1b800011;
  *(undefined1 *)(puVar4 + 1) = 1;
  *(undefined4 **)(puVar4 + 2) = puVar3;
  puVar5 = (undefined4 *)operator_new(0x28);
  *(undefined8 *)(puVar5 + 4) = 0;
  *(undefined8 *)(puVar5 + 6) = 0;
  *(undefined8 *)(puVar5 + 8) = 0;
  *puVar5 = 0x1b800020;
  *(undefined1 *)(puVar5 + 1) = 1;
  *(race_node **)(puVar5 + 2) = prVar1;
  puVar6 = (undefined4 *)operator_new(0x28);
  *(undefined8 *)(puVar6 + 4) = 0;
  *(undefined8 *)(puVar6 + 6) = 0;
  *(undefined8 *)(puVar6 + 8) = 0;
  *puVar6 = 0x1b800021;
  *(undefined1 *)(puVar6 + 1) = 1;
  *(undefined4 **)(puVar6 + 2) = puVar5;
  local_48 = puVar4;
  std::
  vector<ORPG::Characters::RaceSelector::race_node*,std::allocator<ORPG::Characters::RaceSelector::race_node*>>
  ::_M_assign_aux<ORPG::Characters::RaceSelector::race_node*const*>
            ((vector<ORPG::Characters::RaceSelector::race_node*,std::allocator<ORPG::Characters::RaceSelector::race_node*>>
              *)(puVar3 + 4),&local_48);
  local_48 = puVar6;
  std::
  vector<ORPG::Characters::RaceSelector::race_node*,std::allocator<ORPG::Characters::RaceSelector::race_node*>>
  ::_M_assign_aux<ORPG::Characters::RaceSelector::race_node*const*>
            ((vector<ORPG::Characters::RaceSelector::race_node*,std::allocator<ORPG::Characters::RaceSelector::race_node*>>
              *)(puVar5 + 4),&local_48,&local_40);
  local_48 = puVar2;
  local_40 = puVar3;
  local_38 = puVar5;
  std::
  vector<ORPG::Characters::RaceSelector::race_node*,std::allocator<ORPG::Characters::RaceSelector::race_node*>>
  ::_M_assign_aux<ORPG::Characters::RaceSelector::race_node*const*>
            ((vector<ORPG::Characters::RaceSelector::race_node*,std::allocator<ORPG::Characters::RaceSelector::race_node*>>
              *)&this->head->children,&local_48,&stack0xffffffffffffffd0);
  this->current = this->head;
  return;
}

Assistant:

RaceSelector::RaceSelector() {
            head = allocate_node(Race::ID, false, NULL);

            auto human = allocate_node(Human::ID, true, head);

            auto dwarf = allocate_node(Dwarf::ID, true, head);
            auto hillDwarf = allocate_node(HillDwarf::ID, true, dwarf);

            auto elf = allocate_node(Elf::ID, true, head);
            auto highElf = allocate_node(HighElf::ID, true, elf);

            dwarf->children = {
                hillDwarf
            };

            elf->children = {
                highElf
            };

            head->children = {
                human,
                dwarf,
                elf
            };

            current = head;
        }